

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

void pleased(aligntyp g_align)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  obj *otmp_00;
  obj *poVar5;
  bool bVar6;
  bool bVar7;
  uint local_190;
  uint local_188;
  int local_184;
  char *local_178;
  char *local_168;
  int local_150;
  int local_14c;
  int trycnt;
  int sp_no;
  obj *otmp_1;
  char *msg;
  obj *poStack_130;
  int any;
  obj *otmp;
  char repair_buf [256];
  uint local_1c;
  uint local_18;
  int action;
  int kick_on_butt;
  int pat_on_head;
  int trouble;
  aligntyp g_align_local;
  
  kick_on_butt = in_trouble();
  bVar7 = false;
  pcVar3 = align_gname(g_align);
  if (u.ualign.record < 0xe) {
    if (u.ualign.record < 4) {
      bVar6 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar6 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
          bVar1 = dmgtype(youmonst.data,0x24);
          bVar6 = bVar1 != '\0';
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      local_178 = "satisfied";
      if (bVar6) {
        local_178 = "full";
      }
    }
    else {
      bVar6 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar6 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
          bVar1 = dmgtype(youmonst.data,0x24);
          bVar6 = bVar1 != '\0';
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      local_178 = "pleased";
      if (bVar6) {
        local_178 = "ticklish";
      }
    }
    local_168 = local_178;
  }
  else {
    bVar6 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar6 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
        bVar1 = dmgtype(youmonst.data,0x24);
        bVar6 = bVar1 != '\0';
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    local_168 = "well-pleased";
    if (bVar6) {
      local_168 = "pleased as punch";
    }
  }
  pline("You feel that %s is %s.",pcVar3,local_168);
  if ((level->locations[u.ux][u.uy].typ == '!') && (p_aligntyp != u.ualign.type)) {
    adjalign(-1);
    return;
  }
  if ((u.ualign.record < 2) && (kick_on_butt < 1)) {
    adjalign(1);
  }
  if ((kick_on_butt == 0) && (0xd < u.ualign.record)) {
    bVar7 = p_trouble == 0;
  }
  else {
    if (level->locations[u.ux][u.uy].typ == '!') {
      local_184 = ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4 & 8) != 0) + 3;
    }
    else {
      local_184 = 2;
    }
    iVar2 = rn2((int)u.uluck + (int)u.moreluck + local_184);
    local_188 = iVar2 + 1;
    local_1c = local_188;
    if (level->locations[u.ux][u.uy].typ != '!') {
      if (2 < (int)local_188) {
        local_188 = 3;
      }
      local_1c = local_188;
    }
    if (u.ualign.record < 4) {
      bVar6 = true;
      if (u.ualign.record < 1) {
        iVar2 = rnl(2);
        bVar6 = iVar2 == 0;
      }
      local_1c = (uint)bVar6;
    }
    if ((int)local_1c < 5) {
      local_190 = local_1c;
    }
    else {
      local_190 = 5;
    }
    switch(local_190) {
    case 1:
      if (0 < kick_on_butt) {
        fix_worst_trouble(kick_on_butt);
      }
    case 0:
      break;
    case 3:
      fix_worst_trouble(kick_on_butt);
    case 2:
      while (iVar2 = in_trouble(), 0 < iVar2) {
        fix_worst_trouble(iVar2);
      }
      break;
    case 5:
      bVar7 = true;
    case 4:
      do {
        fix_worst_trouble(kick_on_butt);
        kick_on_butt = in_trouble();
      } while (kick_on_butt != 0);
    }
  }
  if (bVar7) {
    iVar2 = rn2(u.uluck + 6 + (int)u.moreluck >> 1);
    switch(iVar2) {
    case 0:
      break;
    case 1:
      if ((uwep != (obj *)0x0) &&
         (((iVar2 = welded(uwep), iVar2 != 0 || (uwep->oclass == '\x02')) ||
          ((uwep->oclass == '\x06' && (objects[uwep->otyp].oc_subtyp != '\0')))))) {
        otmp._0_1_ = '\0';
        if (((*(uint *)&uwep->field_0x4a >> 8 & 3) != 0) ||
           ((*(uint *)&uwep->field_0x4a >> 10 & 3) != 0)) {
          pcVar3 = otense(uwep,"are");
          sprintf((char *)&otmp," and %s now as good as new",pcVar3);
        }
        if ((*(uint *)&uwep->field_0x4a & 1) == 0) {
          if ((*(uint *)&uwep->field_0x4a >> 1 & 1) == 0) {
            bless(uwep);
            *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a & 0xffffffbf | 0x40;
            if (((u.uprops[0x1e].intrinsic == 0) &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              pcVar3 = aobjnam(uwep,"softly glow");
              pcVar4 = hcolor("light blue");
              pcVar4 = an(pcVar4);
              pline("Your %s with %s aura%s.",pcVar3,pcVar4,&otmp);
            }
            else {
              pcVar3 = u_gname();
              pcVar4 = xname(uwep);
              pline("You feel the blessing of %s over your %s.",pcVar3,pcVar4);
            }
            otmp._0_1_ = '\0';
          }
        }
        else {
          uncurse(uwep);
          *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a & 0xffffffbf | 0x40;
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pcVar3 = aobjnam(uwep,"softly glow");
            pcVar4 = hcolor("amber");
            pline("Your %s %s%s.",pcVar3,pcVar4,&otmp);
          }
          else {
            pcVar3 = u_gname();
            pcVar4 = xname(uwep);
            pline("You feel the power of %s over your %s.",pcVar3,pcVar4);
          }
          otmp._0_1_ = '\0';
        }
        if (((*(uint *)&uwep->field_0x4a >> 8 & 3) != 0) ||
           ((*(uint *)&uwep->field_0x4a >> 10 & 3) != 0)) {
          *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a & 0xfffff3ff;
          *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a & 0xfffffcff;
          if ((char)otmp != '\0') {
            if ((u.uprops[0x1e].intrinsic != 0) ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
              bVar7 = false;
              if (ublindf != (obj *)0x0) {
                bVar7 = ublindf->oartifact == '\x1d';
              }
              bVar7 = (bool)(bVar7 ^ 1);
            }
            pcVar3 = "look";
            if (bVar7) {
              pcVar3 = "feel";
            }
            pcVar3 = aobjnam(uwep,pcVar3);
            pline("Your %s as good as new!",pcVar3);
          }
        }
        update_inventory();
      }
      break;
    case 3:
      if (((ushort)u.uevent._0_2_ >> 8 & 1) == 0) {
        if (((ushort)u.uevent._0_2_ >> 6 & 3) == 0) {
          godvoice(g_align,(char *)0x0);
          pcVar3 = "creature";
          if ((youmonst.data)->mlet == '5') {
            pcVar3 = "mortal";
          }
          verbalize("Hark, %s!",pcVar3);
          verbalize("To enter the castle, thou must play the right tune!");
          u.uevent._0_2_ =
               u.uevent._0_2_ & 0xff3f | (((ushort)u.uevent._0_2_ >> 6 & 3) + 1 & 3) << 6;
          break;
        }
        if (((ushort)u.uevent._0_2_ >> 6 & 3) < 2) {
          You_hear("a divine music...");
          pline("It sounds like:  \"%s\".",tune);
          u.uevent._0_2_ =
               u.uevent._0_2_ & 0xff3f | (((ushort)u.uevent._0_2_ >> 6 & 3) + 1 & 3) << 6;
          break;
        }
      }
    case 2:
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pcVar3 = hcolor("golden");
        pcVar3 = an(pcVar3);
        pline("You are surrounded by %s glow.",pcVar3);
      }
      if (u.ulevel < u.ulevelmax) {
        u.ulevelmax = u.ulevelmax + -1;
        pluslvl('\0');
      }
      else {
        u.uhpmax = u.uhpmax + 5;
        if (u.umonnum != u.umonster) {
          u.mhmax = u.mhmax + 5;
        }
      }
      u.uhp = u.uhpmax;
      if (u.umonnum != u.umonster) {
        u.mh = u.mhmax;
      }
      u.acurr.a[0] = u.amax.a[0];
      if (u.uhunger < 900) {
        init_uhunger();
      }
      if (u.uluck < '\0') {
        u.uluck = '\0';
      }
      make_blinded(0,'\x01');
      iflags.botl = '\x01';
      break;
    case 4:
      msg._4_4_ = 0;
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pcVar3 = hcolor("light blue");
        pcVar3 = an(pcVar3);
        pline("You are surrounded by %s aura.",pcVar3);
      }
      else {
        pcVar3 = u_gname();
        pline("You feel the power of %s.",pcVar3);
      }
      for (poStack_130 = invent; poStack_130 != (obj *)0x0; poStack_130 = poStack_130->nobj) {
        if (((*(uint *)&poStack_130->field_0x4a & 1) != 0) &&
           (((uncurse(poStack_130), u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
          pcVar3 = aobjnam(poStack_130,"softly glow");
          pcVar4 = hcolor("amber");
          pline("Your %s %s.",pcVar3,pcVar4);
          *(uint *)&poStack_130->field_0x4a = *(uint *)&poStack_130->field_0x4a & 0xffffffbf | 0x40;
          msg._4_4_ = msg._4_4_ + 1;
        }
      }
      if (msg._4_4_ != 0) {
        update_inventory();
      }
      break;
    case 5:
      godvoice(u.ualign.type,"Thou hast pleased me with thy progress,");
      if ((u.uprops[0x19].intrinsic & 0x7000000) == 0) {
        u.uprops[0x19].intrinsic = u.uprops[0x19].intrinsic | 0x4000000;
        pline("\"and thus I grant thee the gift of %s!\"","Telepathy");
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
          see_monsters();
        }
      }
      else if ((u.uprops[0x1a].intrinsic & 0x7000000) == 0) {
        u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic | 0x4000000;
        pline("\"and thus I grant thee the gift of %s!\"","Speed");
      }
      else if ((u.uprops[0x13].intrinsic & 0x7000000) == 0) {
        u.uprops[0x13].intrinsic = u.uprops[0x13].intrinsic | 0x4000000;
        pline("\"and thus I grant thee the gift of %s!\"","Stealth");
      }
      else {
        if ((u.uprops[0x16].intrinsic & 0x7000000) == 0) {
          u.uprops[0x16].intrinsic = u.uprops[0x16].intrinsic | 0x4000000;
          if (u.ublessed == 0) {
            iVar2 = rn2(3);
            u.ublessed = iVar2 + 2;
          }
        }
        else {
          u.ublessed = u.ublessed + 1;
        }
        pline("\"and thus I grant thee the gift of %s!\"","my protection");
      }
      verbalize("Use it wisely in my name!");
      break;
    case 7:
    case 8:
    case 9:
      if (((flags.elbereth_enabled != '\0') && (0x13 < u.ualign.record)) &&
         (((ushort)u.uevent._0_2_ >> 0xb & 3) == 0)) {
        gcrownu();
        break;
      }
    case 6:
      local_150 = u.ulevel + 1;
      at_your_feet("An object");
      otmp_00 = mkobj(level,'\n','\x01');
      while (local_150 = local_150 + -1, 0 < local_150) {
        if (otmp_00->otyp == 0x1bc) {
          if (((objects[0x1bc].field_0x10 & 1) == 0) ||
             (poVar5 = carrying(0xf7), poVar5 != (obj *)0x0)) break;
        }
        else {
          local_14c = 0;
          while ((local_14c < 0x2b && (spl_book[local_14c].sp_id != otmp_00->otyp))) {
            local_14c = local_14c + 1;
          }
          if ((local_14c == 0x2b) &&
             (iVar2 = spell_skilltype((int)otmp_00->otyp), u.weapon_skills[iVar2].skill != '\0'))
          break;
        }
        iVar2 = rnd_class(bases[10],0x1bc);
        otmp_00->otyp = (short)iVar2;
      }
      bless(otmp_00);
      place_object(otmp_00,level,(int)u.ux,(int)u.uy);
      break;
    default:
      warning("Confused deity!");
    }
  }
  u.ublesscnt = rnz(0x15e);
  local_18 = (uint)(((ushort)u.uevent._0_2_ >> 0xd & 1) != 0);
  if ((flags.elbereth_enabled != '\0') && (((ushort)u.uevent._0_2_ >> 0xb & 3) != 0)) {
    local_18 = local_18 + 1;
  }
  if (local_18 != 0) {
    iVar2 = rnz(1000);
    u.ublesscnt = local_18 * iVar2 + u.ublesscnt;
  }
  return;
}

Assistant:

static void pleased(aligntyp g_align)
{
	/* don't use p_trouble, worst trouble may get fixed while praying */
	int trouble = in_trouble();	/* what's your worst difficulty? */
	int pat_on_head = 0, kick_on_butt;

	pline("You feel that %s is %s.", align_gname(g_align),
	    u.ualign.record >= DEVOUT ?
	    Hallucination ? "pleased as punch" : "well-pleased" :
	    u.ualign.record >= STRIDENT ?
	    Hallucination ? "ticklish" : "pleased" :
	    Hallucination ? "full" : "satisfied");

	/* not your deity */
	if (on_altar() && p_aligntyp != u.ualign.type) {
		adjalign(-1);
		return;
	} else if (u.ualign.record < 2 && trouble <= 0) adjalign(1);

	/* depending on your luck & align level, the god you prayed to will:
	   - fix your worst problem if it's major.
	   - fix all your major problems.
	   - fix your worst problem if it's minor.
	   - fix all of your problems.
	   - do you a gratuitous favor.

	   if you make it to the the last category, you roll randomly again
	   to see what they do for you.

	   If your luck is at least 0, then you are guaranteed rescued
	   from your worst major problem. */

	if (!trouble && u.ualign.record >= DEVOUT) {
	    /* if hero was in trouble, but got better, no special favor */
	    if (p_trouble == 0) pat_on_head = 1;
	} else {
	    int action = rn1(Luck + (on_altar() ? 3 + on_shrine() : 2), 1);

	    if (!on_altar()) action = min(action, 3);
	    if (u.ualign.record < STRIDENT)
		action = (u.ualign.record > 0 || !rnl(2)) ? 1 : 0;

	    switch(min(action,5)) {
	    case 5: pat_on_head = 1;
	    case 4: do fix_worst_trouble(trouble);
		    while ((trouble = in_trouble()) != 0);
		    break;

	    case 3: fix_worst_trouble(trouble);
	    case 2: while ((trouble = in_trouble()) > 0)
		    fix_worst_trouble(trouble);
		    break;

	    case 1: if (trouble > 0) fix_worst_trouble(trouble);
	    case 0: break; /* your god blows you off, too bad */
	    }
	}

    /* note: can't get pat_on_head unless all troubles have just been
       fixed or there were no troubles to begin with; hallucination
       won't be in effect so special handling for it is superfluous */
    if (pat_on_head)
	switch(rn2((Luck + 6)>>1)) {
	case 0:	break;
	case 1:
	    if (uwep && (welded(uwep) || uwep->oclass == WEAPON_CLASS ||
			 is_weptool(uwep))) {
		char repair_buf[BUFSZ];

		*repair_buf = '\0';
		if (uwep->oeroded || uwep->oeroded2)
		    sprintf(repair_buf, " and %s now as good as new",
			    otense(uwep, "are"));

		if (uwep->cursed) {
		    uncurse(uwep);
		    uwep->bknown = TRUE;
		    if (!Blind)
			pline("Your %s %s%s.", aobjnam(uwep, "softly glow"),
			     hcolor("amber"), repair_buf);
		    else pline("You feel the power of %s over your %s.",
			u_gname(), xname(uwep));
		    *repair_buf = '\0';
		} else if (!uwep->blessed) {
		    bless(uwep);
		    uwep->bknown = TRUE;
		    if (!Blind)
			pline("Your %s with %s aura%s.",
			     aobjnam(uwep, "softly glow"),
			     an(hcolor("light blue")), repair_buf);
		    else pline("You feel the blessing of %s over your %s.",
			u_gname(), xname(uwep));
		    *repair_buf = '\0';
		}

		/* fix any rust/burn/rot damage, but don't protect
		   against future damage */
		if (uwep->oeroded || uwep->oeroded2) {
		    uwep->oeroded = uwep->oeroded2 = 0;
		    /* only give this message if we didn't just bless
		       or uncurse (which has already given a message) */
		    if (*repair_buf)
			pline("Your %s as good as new!",
			     aobjnam(uwep, Blind ? "feel" : "look"));
		}
		update_inventory();
	    }
	    break;
	case 3:
	    /* takes 2 hints to get the music to enter the stronghold */
	    if (!u.uevent.uopened_dbridge) {
		if (u.uevent.uheard_tune < 1) {
		    godvoice(g_align,NULL);
		    verbalize("Hark, %s!",
			  youmonst.data->mlet == S_HUMAN ? "mortal" : "creature");
		    verbalize(
			"To enter the castle, thou must play the right tune!");
		    u.uevent.uheard_tune++;
		    break;
		} else if (u.uevent.uheard_tune < 2) {
		    You_hear("a divine music...");
		    pline("It sounds like:  \"%s\".", tune);
		    u.uevent.uheard_tune++;
		    break;
		}
	    }
	    /* Otherwise, falls into next case */
	case 2:
	    if (!Blind)
		pline("You are surrounded by %s glow.", an(hcolor("golden")));
	    /* if any levels have been lost (and not yet regained),
	       treat this effect like blessed full healing */
	    if (u.ulevel < u.ulevelmax) {
		u.ulevelmax -= 1;	/* see potion.c */
		pluslvl(FALSE);
	    } else {
		u.uhpmax += 5;
		if (Upolyd) u.mhmax += 5;
	    }
	    u.uhp = u.uhpmax;
	    if (Upolyd) u.mh = u.mhmax;
	    ABASE(A_STR) = AMAX(A_STR);
	    if (u.uhunger < 900) init_uhunger();
	    if (u.uluck < 0) u.uluck = 0;
	    make_blinded(0L,TRUE);
	    iflags.botl = 1;
	    break;
	case 4: {
	    struct obj *otmp;
	    int any = 0;

	    if (Blind)
		pline("You feel the power of %s.", u_gname());
	    else pline("You are surrounded by %s aura.",
		     an(hcolor("light blue")));
	    for (otmp=invent; otmp; otmp=otmp->nobj) {
		if (otmp->cursed) {
		    uncurse(otmp);
		    if (!Blind) {
			pline("Your %s %s.", aobjnam(otmp, "softly glow"),
			     hcolor("amber"));
			otmp->bknown = TRUE;
			++any;
		    }
		}
	    }
	    if (any) update_inventory();
	    break;
	}
	case 5: {
	    const char *msg="\"and thus I grant thee the gift of %s!\"";
	    godvoice(u.ualign.type, "Thou hast pleased me with thy progress,");
	    if (!(HTelepat & INTRINSIC))  {
		HTelepat |= FROMOUTSIDE;
		pline(msg, "Telepathy");
		if (Blind) see_monsters();
	    } else if (!(HFast & INTRINSIC))  {
		HFast |= FROMOUTSIDE;
		pline(msg, "Speed");
	    } else if (!(HStealth & INTRINSIC))  {
		HStealth |= FROMOUTSIDE;
		pline(msg, "Stealth");
	    } else {
		if (!(HProtection & INTRINSIC))  {
		    HProtection |= FROMOUTSIDE;
		    if (!u.ublessed)  u.ublessed = rn1(3, 2);
		} else u.ublessed++;
		pline(msg, "my protection");
	    }
	    verbalize("Use it wisely in my name!");
	    break;
	}
	case 7:
	case 8:
	case 9:		/* KMH -- can occur during full moons */
	    if (flags.elbereth_enabled)
		if (u.ualign.record >= PIOUS && !u.uevent.uhand_of_elbereth) {
		    gcrownu();
		    break;
		} /* else FALLTHRU */
	case 6:	{
	    struct obj *otmp;
	    int sp_no, trycnt = u.ulevel + 1;

	    at_your_feet("An object");
	    /* not yet known spells given preference over already known ones */
	    /* Also, try to grant a spell for which there is a skill slot */
	    otmp = mkobj(level, SPBOOK_CLASS, TRUE);
	    while (--trycnt > 0) {
		if (otmp->otyp != SPE_BLANK_PAPER) {
		    for (sp_no = 0; sp_no < MAXSPELL; sp_no++)
			if (spl_book[sp_no].sp_id == otmp->otyp) break;
		    if (sp_no == MAXSPELL &&
			!P_RESTRICTED(spell_skilltype(otmp->otyp)))
			break;	/* usable, but not yet known */
		} else {
		    if (!objects[SPE_BLANK_PAPER].oc_name_known ||
			    carrying(MAGIC_MARKER)) break;
		}
		otmp->otyp = rnd_class(bases[SPBOOK_CLASS], SPE_BLANK_PAPER);
	    }
	    bless(otmp);
	    place_object(otmp, level, u.ux, u.uy);
	    break;
	}
	default:	warning("Confused deity!");
	    break;
	}

	u.ublesscnt = rnz(350);
	kick_on_butt = u.uevent.udemigod ? 1 : 0;

	if (flags.elbereth_enabled && u.uevent.uhand_of_elbereth)
	    kick_on_butt++;

	if (kick_on_butt)
	    u.ublesscnt += kick_on_butt * rnz(1000);

	return;
}